

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  allocator<char> local_159;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  undefined1 local_138 [40];
  Paraglob p;
  Paraglob sp;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -n <text> <patterns>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Prints the number of patterns that match the text.\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -b <a> <b> <c> <time>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Benchmark. a - n patterns. b - n queries. c - % matches.\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," -s <patterns>\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"       ");
    std::operator<<(poVar3,"Prints a a paraglob with **patterns** serialization\n");
    exit(1);
  }
  pcVar5 = argv[1];
  uVar6 = (ulong)(uint)argc;
  if (*pcVar5 == '-') {
    if ((pcVar5[1] == 'b') && (pcVar5[2] == '\0')) {
      local_138._8_8_ = (__buckets_ptr)0x0;
      if (argc == 6) {
        local_138._8_8_ = atof(argv[5]);
      }
      dVar7 = benchmark(argv[2],argv[3],argv[4],(bool)(-((double)local_138._8_8_ != 0.0) & 1));
      if ((double)local_138._8_8_ <= 0.0) {
        return 0;
      }
      if (dVar7 <= (double)local_138._8_8_) {
        pcVar5 = "Passed.\n";
      }
      else {
        pcVar5 = "Failed.\n";
      }
      goto LAB_00103705;
    }
    if ((pcVar5[1] != 'n') || (pcVar5[2] != '\0')) {
      if ((pcVar5[1] == 's') && (pcVar5[2] == '\0')) {
        v.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        v.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        v.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (uVar4 = 3; uVar4 < uVar6; uVar4 = uVar4 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&p,argv[uVar4],(allocator<char> *)&sp);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&v,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
          std::__cxx11::string::~string((string *)&p);
        }
        paraglob::Paraglob::Paraglob(&p,&v);
        paraglob::Paraglob::serialize((Paraglob *)local_138);
        paraglob::Paraglob::Paraglob
                  (&sp,(unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_138);
        std::
        unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_138);
        bVar1 = paraglob::Paraglob::operator==(&p,&sp);
        pcVar5 = "failed";
        if (bVar1) {
          pcVar5 = "passed";
        }
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        paraglob::Paraglob::~Paraglob(&sp);
        goto LAB_00103905;
      }
      goto LAB_001036e7;
    }
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar4 = 3; uVar4 < uVar6; uVar4 = uVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,argv[uVar4],(allocator<char> *)&sp);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&v,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
      std::__cxx11::string::~string((string *)&p);
    }
    paraglob::Paraglob::Paraglob(&p,&v);
    std::__cxx11::string::string<std::allocator<char>>((string *)&sp,argv[2],&local_159);
    paraglob::Paraglob::get
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_138 + 0x10),&p,(string *)&sp);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3,"\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_138 + 0x10));
    std::__cxx11::string::~string((string *)&sp);
    paraglob::Paraglob::str_abi_cxx11_((string *)&sp,&p);
    std::operator<<((ostream *)&std::cout,(string *)&sp);
  }
  else {
LAB_001036e7:
    iVar2 = strcmp(pcVar5,"-str");
    if (iVar2 != 0) {
      pcVar5 = "Unrecognized first param\n";
LAB_00103705:
      std::operator<<((ostream *)&std::cout,pcVar5);
      return 0;
    }
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar4 = 3; uVar4 < uVar6; uVar4 = uVar4 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,argv[uVar4],(allocator<char> *)&sp);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&v,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
      std::__cxx11::string::~string((string *)&p);
    }
    paraglob::Paraglob::Paraglob(&p,&v);
    paraglob::Paraglob::str_abi_cxx11_((string *)&sp,&p);
    std::operator<<((ostream *)&std::cout,(string *)&sp);
  }
  std::__cxx11::string::~string((string *)&sp);
LAB_00103905:
  paraglob::Paraglob::~Paraglob(&p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	double max_time = 0;

	if (argc <= 1) {
		std::cerr << "usage: " << argv[0] << " -n <text> <patterns>\n";
		std::cerr << "       " <<
			"Prints the number of patterns that match the text.\n";
		std::cerr << "       " << argv[0] << " -b <a> <b> <c> <time>\n";
		std::cerr << "       " <<
			"Benchmark. a - n patterns. b - n queries. c - % matches.\n";
		std::cerr << "       " << argv[0] << " -s <patterns>\n";
		std::cerr << "       " <<
			"Prints a a paraglob with **patterns** serialization\n";
		exit(1);
	}

	if (strcmp(argv[1], "-b") == 0) {
		if (argc == 6) {
			// there is a time argument
			max_time = atof(argv[5]);
		}

		char* a = argv[2];
		char* b = argv[3];
		char* c = argv[4];
		double elapsed = benchmark(a, b, c, max_time);

		if (max_time > 0) {
			if (elapsed <= max_time) {
				std::cout << "Passed.\n";
			} else {
				std::cout << "Failed.\n";
			}
		}
	} else if (strcmp(argv[1], "-n") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.get(std::string(argv[2])).size() << "\n";
		std::cout << p.str();
	} else if (strcmp(argv[1], "-s") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		try
			{
			paraglob::Paraglob p(v);
			paraglob::Paraglob sp(p.serialize());
			if (p == sp)
				std::cout << "passed" << std::endl;
			else
				std::cout << "failed" << std::endl;
			}
		catch(const paraglob::overflow_error &e)
			{
			std::cerr << e.what() << '\n';
			}
	}
	else if (strcmp(argv[1], "-str") == 0) {
		std::vector<std::string> v;
		for (int i = 3 ; i < argc ; i++) {
			v.push_back(std::string(argv[i]));
		}
		paraglob::Paraglob p(v);
		std::cout << p.str();
	}
	else {
		std::cout << "Unrecognized first param\n";
	}
}